

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApiDebug.cpp
# Opt level: O2

void loadPointProgram(void)

{
  bool bVar1;
  djg_program *program;
  runtime_error *this;
  char buf [1024];
  
  program = djgp_create();
  strcat2(buf,g_app.dir.shader,"Target.glsl");
  djgp_push_file(program,buf);
  bVar1 = djgp_to_gl(program,0x1c2,false,true,g_gl.programs);
  djgp_release(program);
  if (bVar1) {
    return;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"shader creation error");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void loadPointProgram()
{
    djg_program *djp = djgp_create();
    GLuint *glp = &g_gl.programs[PROGRAM_POINT];
    char buf[1024];

    djgp_push_file(djp, strcat2(buf, g_app.dir.shader, "Target.glsl"));
    if (!djgp_to_gl(djp, 450, false, true, glp)) {
        djgp_release(djp);

        throw std::runtime_error("shader creation error");
    }
    djgp_release(djp);
}